

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O3

void Ivy_FastMapPerform(Ivy_Man_t *pAig,int nLimit,int fRecovery,int fVerbose)

{
  char cVar1;
  ushort uVar2;
  void **ppvVar3;
  ulong uVar4;
  ulong uVar5;
  Ivy_Obj_t *pObj;
  Ivy_Man_t *pIVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int *piVar10;
  void *pvVar11;
  undefined8 *puVar12;
  Vec_Ptr_t *pVVar13;
  ushort uVar14;
  short sVar15;
  int iVar16;
  long lVar17;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  int iVar18;
  Ivy_Supp_t *pIVar19;
  undefined4 uVar20;
  undefined4 in_register_00000034;
  long lVar21;
  Ivy_Supp_t *pIVar22;
  char *in_R8;
  long lVar23;
  Ivy_Supp_t *pIVar24;
  Ivy_Supp_t *pIVar25;
  timespec ts;
  timespec local_a8;
  undefined8 local_98;
  Ivy_Man_t *local_90;
  int local_84;
  int local_80;
  int local_7c;
  Ivy_Supp_t *local_78;
  long local_70;
  int local_64;
  long local_60;
  int *local_58;
  long local_50;
  long local_48;
  int *local_40;
  int *local_38;
  
  local_98 = CONCAT44(in_register_00000034,nLimit);
  local_70 = CONCAT44(local_70._4_4_,fRecovery);
  iVar7 = clock_gettime(3,&local_a8);
  iVar18 = 1;
  local_50 = 1;
  if (-1 < iVar7) {
    lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),8);
    local_50 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + local_a8.tv_sec * -1000000;
  }
  piVar10 = (int *)calloc(1,0x20);
  *piVar10 = (int)local_98;
  iVar7 = pAig->vObjs->nSize;
  piVar10[1] = iVar7;
  iVar16 = (int)local_98 * 4 + 0xc;
  piVar10[2] = iVar16;
  pvVar11 = calloc(1,(long)(iVar7 * iVar16));
  *(void **)(piVar10 + 4) = pvVar11;
  puVar12 = (undefined8 *)malloc(0x10);
  *puVar12 = 100;
  pvVar11 = malloc(800);
  puVar12[1] = pvVar11;
  *(undefined8 **)(piVar10 + 6) = puVar12;
  pAig->pData = piVar10;
  local_58 = piVar10;
  iVar7 = clock_gettime(3,&local_a8);
  if (-1 < iVar7) {
    iVar18 = ((int)(SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),8) >> 7) -
             (SUB164(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),0xc) >> 0x1f)) +
             (int)local_a8.tv_sec * -1000000;
  }
  pvVar11 = pAig->pData;
  iVar7 = pAig->pConst1->Id;
  lVar17 = *(long *)((long)pvVar11 + 0x10);
  lVar21 = (long)*(int *)((long)pvVar11 + 8) * (long)iVar7;
  *(undefined2 *)(lVar17 + 8 + lVar21) = 0;
  *(undefined2 *)(lVar17 + lVar21) = 1;
  *(int *)(lVar17 + 0xc + lVar21) = iVar7;
  pVVar13 = pAig->vPis;
  if (0 < pVVar13->nSize) {
    ppvVar3 = pVVar13->pArray;
    lVar21 = 0;
    do {
      iVar7 = *ppvVar3[lVar21];
      lVar23 = (long)*(int *)((long)pvVar11 + 8) * (long)iVar7;
      *(undefined2 *)(lVar17 + 8 + lVar23) = 0;
      *(undefined2 *)(lVar17 + lVar23) = 1;
      *(int *)(lVar17 + 0xc + lVar23) = iVar7;
      lVar21 = lVar21 + 1;
      in_R8 = (char *)(long)pVVar13->nSize;
    } while (lVar21 < (long)in_R8);
  }
  pVVar13 = pAig->vObjs;
  local_90 = pAig;
  local_80 = fVerbose;
  if (0 < pVVar13->nSize) {
    lVar17 = 0;
    do {
      pIVar6 = local_90;
      piVar10 = (int *)pVVar13->pArray[lVar17];
      if ((piVar10 != (int *)0x0) && (0xfffffffd < (piVar10[2] & 0xfU) - 7)) {
        uVar4 = *(ulong *)(piVar10 + 4);
        uVar5 = *(ulong *)(piVar10 + 6);
        uVar8 = *(uint *)(uVar4 & 0xfffffffffffffffe);
        in_R8 = (char *)(ulong)uVar8;
        iVar7 = *(int *)((long)pAig->pData + 8);
        lVar23 = (long)iVar7;
        lVar21 = *(long *)((long)pAig->pData + 0x10);
        pIVar25 = (Ivy_Supp_t *)(lVar21 + (int)(iVar7 * uVar8));
        iVar16 = *(int *)(uVar5 & 0xfffffffffffffffe);
        pIVar19 = (Ivy_Supp_t *)(lVar21 + iVar16 * iVar7);
        pIVar24 = (Ivy_Supp_t *)(lVar21 + *piVar10 * lVar23);
        *(undefined1 *)(lVar21 + 1 + *piVar10 * lVar23) = 0;
        uVar2 = *(ushort *)(lVar21 + 8 + (long)(int)(iVar7 * uVar8));
        uVar14 = *(ushort *)(lVar21 + 8 + (long)(iVar16 * iVar7));
        if (uVar2 == uVar14) {
          uVar14 = 1;
          if (1 < uVar2) {
            uVar14 = uVar2;
          }
          pIVar24->Delay = uVar14;
        }
        else if ((short)uVar14 < (short)uVar2) {
          pIVar24->Delay = uVar2;
          lVar23 = local_90->pConst1->Id * lVar23;
          pIVar19 = (Ivy_Supp_t *)(lVar21 + lVar23);
          if (uVar5 == 0) {
            iVar16 = 0;
          }
          *(int *)(lVar21 + 0xc + lVar23) = iVar16;
        }
        else {
          pIVar24->Delay = uVar14;
          lVar23 = local_90->pConst1->Id * lVar23;
          pIVar25 = (Ivy_Supp_t *)(lVar21 + lVar23);
          if (uVar4 == 0) {
            uVar8 = 0;
          }
          in_R8 = (char *)(ulong)uVar8;
          *(uint *)(lVar21 + 0xc + lVar23) = uVar8;
        }
        pIVar22 = pIVar19;
        if (pIVar25->nSize < pIVar19->nSize) {
          pIVar22 = pIVar25;
          pIVar25 = pIVar19;
        }
        iVar7 = Ivy_FastMapMerge(pIVar25,pIVar22,pIVar24,(int)local_98);
        sVar15 = pIVar24->Delay;
        if (iVar7 == 0) {
          sVar15 = sVar15 + 1;
          pIVar24->Delay = sVar15;
          pIVar24->nSize = '\x02';
          iVar7 = 0;
          uVar20 = 0;
          if (*(ulong *)(piVar10 + 4) != 0) {
            uVar20 = *(undefined4 *)(*(ulong *)(piVar10 + 4) & 0xfffffffffffffffe);
          }
          pIVar24[1].nSize = (char)uVar20;
          pIVar24[1].fMark = (char)((uint)uVar20 >> 8);
          pIVar24[1].fMark2 = (char)((uint)uVar20 >> 0x10);
          pIVar24[1].fMark3 = (char)((uint)uVar20 >> 0x18);
          if (*(ulong *)(piVar10 + 6) != 0) {
            iVar7 = *(int *)(*(ulong *)(piVar10 + 6) & 0xfffffffffffffffe);
          }
          pIVar24[1].nRefs = iVar7;
        }
        if (sVar15 < 1) {
          __assert_fail("pSupp->Delay > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFastMap.c"
                        ,0x2b5,"void Ivy_FastMapNode(Ivy_Man_t *, Ivy_Obj_t *, int)");
        }
        pVVar13 = pIVar6->vObjs;
        pAig = pIVar6;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < pVVar13->nSize);
  }
  uVar8 = Ivy_FastMapDelay(pAig);
  iVar16 = Ivy_FastMapArea(pAig);
  iVar7 = local_80;
  if (local_80 != 0) {
    iVar9 = clock_gettime(3,&local_a8);
    if (iVar9 < 0) {
      iVar9 = -1;
    }
    else {
      iVar9 = (int)(local_a8.tv_nsec / 1000) + (int)local_a8.tv_sec * 1000000;
    }
    Ivy_FastMapPrint((Ivy_Man_t *)(ulong)uVar8,iVar16,iVar9 + iVar18,0x99cf46,in_R8);
  }
  if ((int)local_70 != 0) {
    iVar18 = clock_gettime(3,&local_a8);
    if (iVar18 < 0) {
      iVar18 = 1;
      lVar17 = extraout_RDX;
    }
    else {
      lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),8);
      iVar18 = ((int)(lVar17 >> 7) -
               (SUB164(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),0xc) >> 0x1f)) +
               (int)local_a8.tv_sec * -1000000;
    }
    Ivy_FastMapRequired(pAig,uVar8,(int)lVar17);
    Ivy_FastMapRecover(pAig,(int)local_98);
    uVar8 = Ivy_FastMapDelay(pAig);
    iVar16 = Ivy_FastMapArea(pAig);
    if (iVar7 != 0) {
      iVar7 = clock_gettime(3,&local_a8);
      if (iVar7 < 0) {
        iVar7 = -1;
      }
      else {
        iVar7 = (int)(local_a8.tv_nsec / 1000) + (int)local_a8.tv_sec * 1000000;
      }
      Ivy_FastMapPrint((Ivy_Man_t *)(ulong)uVar8,iVar16,iVar7 + iVar18,0x99cf5f,in_R8);
    }
    iVar7 = clock_gettime(3,&local_a8);
    if (iVar7 < 0) {
      local_60 = 1;
      lVar17 = extraout_RDX_00;
    }
    else {
      lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),8);
      lVar17 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + local_a8.tv_sec * -1000000;
      local_60 = lVar17;
    }
    Ivy_FastMapRequired(pAig,uVar8,(int)lVar17);
    pVVar13 = pAig->vObjs;
    if (0 < pVVar13->nSize) {
      lVar17 = 0;
      do {
        pObj = (Ivy_Obj_t *)pVVar13->pArray[lVar17];
        if ((pObj != (Ivy_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pObj->field_0x8 & 0xf) - 7)) {
          if (0x20 < (int)local_98) {
            __assert_fail("nLimit <= 32",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFastMap.c"
                          ,0x1c3,"void Ivy_FastMapNodeArea(Ivy_Man_t *, Ivy_Obj_t *, int)");
          }
          local_70 = (long)*(int *)((long)pAig->pData + 8);
          lVar21 = *(long *)((long)pAig->pData + 0x10);
          lVar23 = pObj->Id * local_70;
          if (*(char *)(lVar21 + 1 + lVar23) != '\0') {
            __assert_fail("pSupp->fMark == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFastMap.c"
                          ,0x1cc,"void Ivy_FastMapNodeArea(Ivy_Man_t *, Ivy_Obj_t *, int)");
          }
          local_38 = (int *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
          local_40 = (int *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
          local_78 = (Ivy_Supp_t *)(long)*local_38;
          local_48 = (long)*local_40;
          pIVar25 = (Ivy_Supp_t *)(lVar23 + lVar21);
          if (pIVar25->nRefs == 0) {
            local_84 = Ivy_FastMapNodeAreaDerefed(local_90,pObj);
          }
          else {
            local_84 = Ivy_FastMapNodeAreaRefed(local_90,pObj);
          }
          pIVar6 = local_90;
          if (pIVar25->nRefs != 0) {
            Ivy_FastMapNodeDeref(local_90,(Ivy_Obj_t *)(ulong)(uint)pObj->Id);
          }
          local_64 = Ivy_FastMapNodeDelay(pIVar6,(Ivy_Obj_t *)(ulong)(uint)pObj->Id);
          local_7c = (int)pIVar25->DelayR;
          if (local_7c < local_64) {
            __assert_fail("DelayOld <= pSupp->DelayR",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFastMap.c"
                          ,0x1dc,"void Ivy_FastMapNodeArea(Ivy_Man_t *, Ivy_Obj_t *, int)");
          }
          pIVar19 = (Ivy_Supp_t *)((long)local_78 * local_70 + lVar21);
          local_78 = pIVar25 + 1;
          cVar1 = pIVar25->nSize;
          memcpy(Ivy_FastMapNodeArea_Store,local_78,(long)(int)cVar1 * 4);
          iVar7 = local_84;
          if ((2 < local_38[3]) && (pIVar19->Delay < (short)local_7c)) {
            Ivy_FastMapNodeArea_Supp0 = 1;
            if (pObj->pFanin0 == (Ivy_Obj_t *)0x0) {
              _DAT_00ce07ac = 0;
            }
            else {
              _DAT_00ce07ac = *(undefined4 *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
            }
            pIVar19 = (Ivy_Supp_t *)&Ivy_FastMapNodeArea_Supp0;
          }
          pIVar24 = (Ivy_Supp_t *)(lVar21 + local_48 * local_70);
          if ((2 < local_40[3]) && (pIVar24->Delay < (short)local_7c)) {
            Ivy_FastMapNodeArea_Supp1 = 1;
            if (pObj->pFanin1 == (Ivy_Obj_t *)0x0) {
              _DAT_00ce07bc = 0;
            }
            else {
              _DAT_00ce07bc = *(undefined4 *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
            }
            pIVar24 = (Ivy_Supp_t *)&Ivy_FastMapNodeArea_Supp1;
          }
          pIVar22 = pIVar24;
          if (pIVar19->nSize < pIVar24->nSize) {
            pIVar22 = pIVar19;
            pIVar19 = pIVar24;
          }
          _Ivy_FastMapNodeArea_StoreSize = (int)cVar1;
          iVar18 = Ivy_FastMapMerge(pIVar19,pIVar22,pIVar25,(int)local_98);
          pAig = local_90;
          if (iVar18 == 0) {
            pIVar25->nSize = '\x02';
            iVar18 = 0;
            uVar20 = 0;
            if (pObj->pFanin0 != (Ivy_Obj_t *)0x0) {
              uVar20 = *(undefined4 *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
            }
            local_78->nSize = (char)uVar20;
            local_78->fMark = (char)((uint)uVar20 >> 8);
            local_78->fMark2 = (char)((uint)uVar20 >> 0x10);
            local_78->fMark3 = (char)((uint)uVar20 >> 0x18);
            if (pObj->pFanin1 != (Ivy_Obj_t *)0x0) {
              iVar18 = *(int *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
            }
            pIVar25[1].nRefs = iVar18;
          }
          iVar18 = Ivy_FastMapNodeDelay(local_90,(Ivy_Obj_t *)(ulong)(uint)pObj->Id);
          pIVar25->Delay = (short)iVar18;
          iVar18 = pIVar25->nRefs;
          pIVar25->nRefs = 0;
          iVar16 = Ivy_FastMapNodeAreaDerefed(pAig,pObj);
          pIVar25->nRefs = iVar18;
          if ((iVar7 < iVar16) || (pIVar25->DelayR < pIVar25->Delay)) {
            lVar21 = (long)Ivy_FastMapNodeArea_StoreSize;
            pIVar25->nSize = Ivy_FastMapNodeArea_StoreSize;
            memcpy(local_78,Ivy_FastMapNodeArea_Store,lVar21 << 2);
            pIVar25->Delay = (short)local_64;
          }
          if (iVar18 != 0) {
            Ivy_FastMapNodeRef(pAig,(Ivy_Obj_t *)(ulong)(uint)pObj->Id);
          }
        }
        lVar17 = lVar17 + 1;
        pVVar13 = pAig->vObjs;
      } while (lVar17 < pVVar13->nSize);
    }
    uVar8 = Ivy_FastMapDelay(pAig);
    iVar18 = Ivy_FastMapArea(pAig);
    iVar7 = local_80;
    if (local_80 != 0) {
      iVar16 = clock_gettime(3,&local_a8);
      if (iVar16 < 0) {
        iVar16 = -1;
      }
      else {
        iVar16 = (int)(local_a8.tv_nsec / 1000) + (int)local_a8.tv_sec * 1000000;
      }
      Ivy_FastMapPrint((Ivy_Man_t *)(ulong)uVar8,iVar18,iVar16 + (int)local_60,0x99cf78,in_R8);
    }
    iVar18 = clock_gettime(3,&local_a8);
    if (iVar18 < 0) {
      iVar18 = 1;
      lVar17 = extraout_RDX_01;
    }
    else {
      lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),8);
      iVar18 = ((int)(lVar17 >> 7) -
               (SUB164(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),0xc) >> 0x1f)) +
               (int)local_a8.tv_sec * -1000000;
    }
    Ivy_FastMapRequired(pAig,uVar8,(int)lVar17);
    Ivy_FastMapRecover(pAig,(int)local_98);
    uVar8 = Ivy_FastMapDelay(pAig);
    iVar16 = Ivy_FastMapArea(pAig);
    if (iVar7 != 0) {
      iVar7 = clock_gettime(3,&local_a8);
      if (iVar7 < 0) {
        iVar7 = -1;
      }
      else {
        iVar7 = (int)(local_a8.tv_nsec / 1000) + (int)local_a8.tv_sec * 1000000;
      }
      Ivy_FastMapPrint((Ivy_Man_t *)(ulong)uVar8,iVar16,iVar7 + iVar18,0x99cf5f,in_R8);
    }
  }
  iVar7 = clock_gettime(3,&local_a8);
  if (iVar7 < 0) {
    lVar17 = -1;
  }
  else {
    lVar17 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
  }
  s_MappingTime = lVar17 + local_50;
  s_MappingMem = local_58[2] * local_58[1];
  return;
}

Assistant:

void Ivy_FastMapPerform( Ivy_Man_t * pAig, int nLimit, int fRecovery, int fVerbose )
{
    Ivy_SuppMan_t * pMan;
    Ivy_Obj_t * pObj;
    int i, Delay, Area;
    abctime clk, clkTotal = Abc_Clock();
    // start the memory for supports
    pMan = ABC_ALLOC( Ivy_SuppMan_t, 1 );
    memset( pMan, 0, sizeof(Ivy_SuppMan_t) );
    pMan->nLimit = nLimit;
    pMan->nObjs  = Ivy_ManObjIdMax(pAig) + 1;
    pMan->nSize  = sizeof(Ivy_Supp_t) + nLimit * sizeof(int);
    pMan->pMem   = (char *)ABC_ALLOC( char, pMan->nObjs * pMan->nSize );
    memset( pMan->pMem, 0, pMan->nObjs * pMan->nSize );
    pMan->vLuts  = Vec_VecAlloc( 100 );
    pAig->pData  = pMan;
clk = Abc_Clock();
    // set the PI mapping
    Ivy_ObjSuppStart( pAig, Ivy_ManConst1(pAig) );
    Ivy_ManForEachPi( pAig, pObj, i )
        Ivy_ObjSuppStart( pAig, pObj );
    // iterate through all nodes in the topological order
    Ivy_ManForEachNode( pAig, pObj, i )
        Ivy_FastMapNode( pAig, pObj, nLimit );
    // find the best arrival time and area
    Delay = Ivy_FastMapDelay( pAig );
    Area = Ivy_FastMapArea(pAig);
    if ( fVerbose )
        Ivy_FastMapPrint( pAig, Delay, Area, Abc_Clock() - clk, "Delay oriented mapping: " );

// 2-1-2 (doing 2-1-2-1-2 improves 0.5%)

    if ( fRecovery )
    {
clk = Abc_Clock();
    Ivy_FastMapRequired( pAig, Delay, 0 );
    // remap the nodes
    Ivy_FastMapRecover( pAig, nLimit );
    Delay = Ivy_FastMapDelay( pAig );
    Area = Ivy_FastMapArea(pAig);
    if ( fVerbose )
        Ivy_FastMapPrint( pAig, Delay, Area, Abc_Clock() - clk, "Area recovery 2       : " );

clk = Abc_Clock();
    Ivy_FastMapRequired( pAig, Delay, 0 );
    // iterate through all nodes in the topological order
    Ivy_ManForEachNode( pAig, pObj, i )
        Ivy_FastMapNodeArea( pAig, pObj, nLimit );
    Delay = Ivy_FastMapDelay( pAig );
    Area = Ivy_FastMapArea(pAig);
    if ( fVerbose )
        Ivy_FastMapPrint( pAig, Delay, Area, Abc_Clock() - clk, "Area recovery 1       : " );

clk = Abc_Clock();
    Ivy_FastMapRequired( pAig, Delay, 0 );
    // remap the nodes
    Ivy_FastMapRecover( pAig, nLimit );
    Delay = Ivy_FastMapDelay( pAig );
    Area = Ivy_FastMapArea(pAig);
    if ( fVerbose )
        Ivy_FastMapPrint( pAig, Delay, Area, Abc_Clock() - clk, "Area recovery 2       : " );
    }


    s_MappingTime = Abc_Clock() - clkTotal;
    s_MappingMem = pMan->nObjs * pMan->nSize;
/*
    {
        Vec_Ptr_t * vNodes;
        vNodes = Vec_PtrAlloc( 100 );
        Vec_VecForEachEntry( Ivy_Obj_t *, pMan->vLuts, pObj, i, k )
            Vec_PtrPush( vNodes, pObj );
        Ivy_ManShow( pAig, 0, vNodes );
        Vec_PtrFree( vNodes );
    }
*/
}